

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O1

void rfc5444_writer_unregister_target(rfc5444_writer *writer,rfc5444_writer_target *interf)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    plVar1 = (interf->_target_node).next;
    if ((plVar1 != (list_entity *)0x0) && ((interf->_target_node).prev != (list_entity *)0x0)) {
      plVar2 = (interf->_target_node).prev;
      plVar2->next = plVar1;
      plVar1->prev = plVar2;
      (interf->_target_node).next = (list_entity *)0x0;
      (interf->_target_node).prev = (list_entity *)0x0;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x231,
                "void rfc5444_writer_unregister_target(struct rfc5444_writer *, struct rfc5444_writer_target *)"
               );
}

Assistant:

void
rfc5444_writer_unregister_target(
  struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_target *interf) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* remove interface from writer */
  if (list_is_node_added(&interf->_target_node)) {
    list_remove(&interf->_target_node);
  }
}